

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnSegment::Scan
          (ColumnSegment *this,ColumnScanState *state,idx_t scan_count,Vector *result,
          idx_t result_offset,ScanVectorType scan_type)

{
  CompressionFunction *pCVar1;
  
  pCVar1 = (this->function)._M_data;
  if (scan_type != SCAN_ENTIRE_VECTOR) {
    (*pCVar1->scan_partial)(this,state,scan_count,result,result_offset);
    return;
  }
  (*pCVar1->scan_vector)(this,state,scan_count,result);
  return;
}

Assistant:

void ColumnSegment::Scan(ColumnScanState &state, idx_t scan_count, Vector &result, idx_t result_offset,
                         ScanVectorType scan_type) {
	if (scan_type == ScanVectorType::SCAN_ENTIRE_VECTOR) {
		D_ASSERT(result_offset == 0);
		Scan(state, scan_count, result);
	} else {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		ScanPartial(state, scan_count, result, result_offset);
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	}
}